

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger array_reduce(HSQUIRRELVM v)

{
  SQArray *this;
  bool bVar1;
  SQObject *o_00;
  SQRESULT SVar2;
  SQObjectPtr *obj;
  SQObjectPtr local_78;
  long local_68;
  SQInteger n;
  SQObjectPtr other;
  undefined1 local_40 [8];
  SQObjectPtr res;
  SQInteger size;
  SQArray *a;
  SQObject *o;
  HSQUIRRELVM v_local;
  
  o_00 = &stack_get(v,1)->super_SQObject;
  this = (o_00->_unVal).pArray;
  res.super_SQObject._unVal.nInteger = SQArray::Size(this);
  if (res.super_SQObject._unVal.pTable == (SQTable *)0x0) {
    return 0;
  }
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_40);
  SQArray::Get(this,0,(SQObjectPtr *)local_40);
  if (1 < res.super_SQObject._unVal.nInteger) {
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)&n);
    for (local_68 = 1; local_68 < res.super_SQObject._unVal.nInteger; local_68 = local_68 + 1) {
      SQArray::Get(this,local_68,(SQObjectPtr *)&n);
      SQObjectPtr::SQObjectPtr(&local_78,o_00);
      SQVM::Push(v,&local_78);
      SQObjectPtr::~SQObjectPtr(&local_78);
      SQVM::Push(v,(SQObjectPtr *)local_40);
      SQVM::Push(v,(SQObjectPtr *)&n);
      SVar2 = sq_call(v,3,1,0);
      if (SVar2 < 0) {
        v_local = (HSQUIRRELVM)0xffffffffffffffff;
        bVar1 = true;
        goto LAB_00143037;
      }
      obj = SQVM::GetUp(v,-1);
      SQObjectPtr::operator=((SQObjectPtr *)local_40,obj);
      SQVM::Pop(v);
    }
    bVar1 = false;
LAB_00143037:
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&n);
    if (bVar1) goto LAB_00143074;
  }
  SQVM::Push(v,(SQObjectPtr *)local_40);
  v_local = (HSQUIRRELVM)0x1;
LAB_00143074:
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_40);
  return (SQInteger)v_local;
}

Assistant:

static SQInteger array_reduce(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQArray *a = _array(o);
    SQInteger size = a->Size();
    if(size == 0) {
        return 0;
    }
    SQObjectPtr res;
    a->Get(0,res);
    if(size > 1) {
        SQObjectPtr other;
        for(SQInteger n = 1; n < size; n++) {
            a->Get(n,other);
            v->Push(o);
            v->Push(res);
            v->Push(other);
            if(SQ_FAILED(sq_call(v,3,SQTrue,SQFalse))) {
                return SQ_ERROR;
            }
            res = v->GetUp(-1);
            v->Pop();
        }
    }
    v->Push(res);
    return 1;
}